

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,_unsigned_long>,_std::hash<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,_unsigned_long>,_std::hash<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>_>
                *this)

{
  size_t capacity;
  long lVar1;
  size_t i;
  size_t sVar2;
  Layout LVar3;
  
  capacity = *(size_t *)(this + 0x18);
  if (capacity != 0) {
    lVar1 = 8;
    sVar2 = 0;
    do {
      if ((-1 < *(char *)(*(long *)this + sVar2)) &&
         (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(this + 8) + lVar1) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(this + 8) + lVar1));
        capacity = *(size_t *)(this + 0x18);
      }
      sVar2 = sVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (sVar2 != capacity);
    LVar3 = MakeLayout(capacity);
    Deallocate<8ul,std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
              ((allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_> *)
               (this + 0x28),*(void **)this,
               (LVar3.
                super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>
                .size_[0] + 7 & 0xfffffffffffffff8) +
               LVar3.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>
               .size_[1] * 0x18);
    *(undefined1 **)this = EmptyGroup()::empty_group;
    *(undefined8 *)(this + 0x28) = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
  }
  return;
}

Assistant:

void destroy_slots() {
        if (!capacity_) return;
        for (size_t i = 0; i != capacity_; ++i) {
            if (IsFull(ctrl_[i])) {
                PolicyTraits::destroy(&alloc_ref(), slots_ + i);
            }
        }
        auto layout = MakeLayout(capacity_);
        // Unpoison before returning the memory to the allocator.
        SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
        Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
        ctrl_ = EmptyGroup();
        slots_ = nullptr;
        size_ = 0;
        capacity_ = 0;
        growth_left() = 0;
    }